

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5TransponderStatus.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::Mode5TransponderStatus::Mode5TransponderStatus
          (Mode5TransponderStatus *this,Mode5Reply R,KBOOL LineTest,AntennaSelection AS,KBOOL Crypto
          ,KBOOL LocationIncluded,KBOOL LocationErrorIncluded,PlatformType PT,KBOOL Lvl2Included,
          KBOOL Status,KBOOL Dmg,KBOOL Malfnc)

{
  KBOOL Malfnc_local;
  KBOOL Dmg_local;
  KBOOL Status_local;
  KBOOL Lvl2Included_local;
  KBOOL LocationErrorIncluded_local;
  KBOOL LocationIncluded_local;
  KBOOL Crypto_local;
  AntennaSelection AS_local;
  KBOOL LineTest_local;
  Mode5Reply R_local;
  Mode5TransponderStatus *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__Mode5TransponderStatus_00332080;
  (this->m_StatusUnion).m_ui16Status = (this->m_StatusUnion).m_ui16Status & 0xfff0 | (ushort)R & 0xf
  ;
  (this->m_StatusUnion).m_ui16Status =
       (this->m_StatusUnion).m_ui16Status & 0xffef | (ushort)LineTest << 4;
  (this->m_StatusUnion).m_ui16Status =
       (this->m_StatusUnion).m_ui16Status & 0xff9f | ((ushort)AS & 3) << 5;
  (this->m_StatusUnion).m_ui16Status =
       (this->m_StatusUnion).m_ui16Status & 0xff7f | (ushort)Crypto << 7;
  (this->m_StatusUnion).m_ui16Status =
       (this->m_StatusUnion).m_ui16Status & 0xfeff | (ushort)LocationIncluded << 8;
  (this->m_StatusUnion).m_ui16Status =
       (this->m_StatusUnion).m_ui16Status & 0xfdff | (ushort)LocationErrorIncluded << 9;
  (this->m_StatusUnion).m_ui16Status =
       (this->m_StatusUnion).m_ui16Status & 0xfbff | ((ushort)PT & 1) << 10;
  (this->m_StatusUnion).m_ui16Status =
       (this->m_StatusUnion).m_ui16Status & 0xf7ff | (ushort)Lvl2Included << 0xb;
  (this->m_StatusUnion).m_ui16Status = (this->m_StatusUnion).m_ui16Status & 0xefff;
  (this->m_StatusUnion).m_ui16Status =
       (this->m_StatusUnion).m_ui16Status & 0xdfff | (ushort)Status << 0xd;
  (this->m_StatusUnion).m_ui16Status =
       (this->m_StatusUnion).m_ui16Status & 0xbfff | (ushort)Dmg << 0xe;
  (this->m_StatusUnion).m_ui16Status =
       (this->m_StatusUnion).m_ui16Status & 0x7fff | (ushort)Malfnc << 0xf;
  return;
}

Assistant:

Mode5TransponderStatus::Mode5TransponderStatus( KDIS::DATA_TYPE::ENUMS::Mode5Reply R, KBOOL LineTest, KDIS::DATA_TYPE::ENUMS::AntennaSelection AS, KBOOL Crypto,
	                                            KBOOL LocationIncluded, KBOOL LocationErrorIncluded, KDIS::DATA_TYPE::ENUMS::PlatformType PT, KBOOL Lvl2Included,
                                                KBOOL Status, KBOOL Dmg, KBOOL Malfnc )
{	
	m_StatusUnion.m_ui16Reply = R;
	m_StatusUnion.m_ui16LineTst = LineTest;      
	m_StatusUnion.m_ui16AntennaSel = AS;
	m_StatusUnion.m_ui16CryptoCtrl = Crypto; 
	m_StatusUnion.m_ui16LatLonAltSrc = LocationIncluded;
	m_StatusUnion.m_ui16LocErrs = LocationErrorIncluded;
	m_StatusUnion.m_ui16PlatfrmTyp = PT;
	m_StatusUnion.m_ui16LvlSel = Lvl2Included;
	m_StatusUnion.m_ui16Padding = 0;
	m_StatusUnion.m_ui16OnOff = Status;
	m_StatusUnion.m_ui16Dmg = Dmg;          
	m_StatusUnion.m_ui16MalFnc = Malfnc;   	
}